

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O3

AST * parse_primary_expression(Translation_Data *translation_data,Scope *scope)

{
  KEYWORDS KVar1;
  char cVar2;
  token *string;
  AST_Constant *pAVar3;
  AST_Error *pAVar4;
  AST_Lvalue_Expression *pAVar5;
  AST_String_Literal *pAVar6;
  AST *error;
  char *error_message;
  
  if (translation_data->tokens->size == 0) {
    error_message = "expected something here";
  }
  else {
    string = (token *)Queue_Pop(translation_data->tokens);
    KVar1 = string->type;
    if (KVar1 - KW_HEXADECIMAL_CONSTANT < 0x18) {
LAB_001421a4:
      pAVar3 = get_constant_tree(string);
      return (AST *)pAVar3;
    }
    if ((int)KVar1 < 0x6d) {
      if (KVar1 - KW_CHAR_CONSTANT < 2) goto LAB_001421a4;
      if (KVar1 == KW_OPEN_NORMAL) {
        error = parse_comma_expression(translation_data,scope);
        cVar2 = get_and_check(translation_data,KW_CLOSE_NORMAL);
        if (cVar2 != '\0') {
          return error;
        }
        push_translation_error("expected \')\' here",translation_data);
        goto LAB_001421c4;
      }
      if (KVar1 == KW_ID) {
        pAVar5 = get_lvalue_expression_tree(string,scope);
        return (AST *)pAVar5;
      }
    }
    else if (KVar1 - KW_STRING < 2) {
      pAVar6 = get_string_literal_tree(string);
      return (AST *)pAVar6;
    }
    error_message = "error in expression";
  }
  push_translation_error(error_message,translation_data);
  error = (AST *)0x0;
LAB_001421c4:
  pAVar4 = get_error_tree(error);
  return (AST *)pAVar4;
}

Assistant:

struct AST* parse_primary_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct token *hold_token;
	struct AST *hold;
	
	if(translation_data->tokens->size==0)
	{
		/*TODO error*/
		push_translation_error("expected something here",translation_data);
		return (struct AST*)get_error_tree(NULL);
	}
	hold_token=Queue_Pop(translation_data->tokens);
	switch(hold_token->type)
	{
		case KW_STRING:
		case KW_WIDE_STRING:
			return (struct AST*)get_string_literal_tree(hold_token);
		case KW_CHAR_CONSTANT:
		case KW_WIDE_CHAR_CONSTANT:
		case KW_HEXADECIMAL_CONSTANT:
		case KW_DECIMAL_CONSTANT:
		case KW_OCTAL_CONSTANT:
		case KW_UNSIGNED_DECIMAL_CONSTANT:
		case KW_UNSIGNED_OCTAL_CONSTANT:
		case KW_UNSIGNED_HEXADECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_HEXADECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_OCTAL_CONSTANT:
		case KW_UNSIGNED_LONG_DECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_LONG_DECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_LONG_HEXADECIMAL_CONSTANT:
		case KW_UNSIGNED_LONG_LONG_OCTAL_CONSTANT:
		case KW_LONG_HEXADECIMAL_CONSTANT:
		case KW_LONG_OCTAL_CONSTANT:
		case KW_LONG_DECIMAL_CONSTANT:
		case KW_LONG_LONG_HEXADECIMAL_CONSTANT:
		case KW_LONG_LONG_OCTAL_CONSTANT:
		case KW_LONG_LONG_DECIMAL_CONSTANT:
		case KW_DOUBLE_DECIMAL_CONSTANT:
		case KW_LONG_DOUBLE_DECIMAL_CONSTANT:
		case KW_FLOAT_DECIMAL_CONSTANT:
		case KW_DOUBLE_HEXADECIMAL_CONSTANT:
		case KW_LONG_DOUBLE_HEXADECIMAL_CONSTANT:
		case KW_FLOAT_HEXADECIMAL_CONSTANT:
			return (struct AST*)get_constant_tree(hold_token);

		case KW_ID:
			return (struct AST*)get_lvalue_expression_tree(hold_token,scope);
		case KW_OPEN_NORMAL:
			hold=parse_expression(translation_data,scope);
			if(get_and_check(translation_data,KW_CLOSE_NORMAL))
			{
				return (struct AST*)hold;
			}else
			{
				/*TODO error*/
				push_translation_error("expected ')' here",translation_data);
				return (struct AST*)get_error_tree(hold);
			}
		default:
			/*TODO error*/
			push_translation_error("error in expression",translation_data);
			return (struct AST*)get_error_tree(NULL);
	}

	/*just in case*/
	assert(0);
	return (struct AST*)get_error_tree(NULL);

}